

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

bool __thiscall
metaf::VisibilityGroup::appendFraction(VisibilityGroup *this,string *group,IncompleteText next)

{
  bool bVar1;
  long lVar2;
  Distance *pDVar3;
  undefined4 in_EDX;
  char in_SIL;
  Distance *in_RDI;
  optional<metaf::Distance> d;
  optional<metaf::Distance> v;
  bool in_stack_000000af;
  string *in_stack_000000b0;
  Distance *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  bool local_1;
  
  lVar2 = std::__cxx11::string::find(in_SIL,0x2f);
  if (lVar2 == -1) {
    local_1 = false;
  }
  else {
    Distance::fromMileString(in_stack_000000b0,in_stack_000000af);
    bVar1 = std::optional<metaf::Distance>::has_value((optional<metaf::Distance> *)0x24424d);
    if (bVar1) {
      bVar1 = Distance::isReported(in_RDI);
      if (bVar1) {
        std::optional<metaf::Distance>::operator*((optional<metaf::Distance> *)0x244286);
        Distance::fromIntegerAndFraction
                  ((Distance *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8)
        ;
        bVar1 = std::optional<metaf::Distance>::has_value((optional<metaf::Distance> *)0x2442a1);
        if (!bVar1) {
          return false;
        }
        pDVar3 = std::optional<metaf::Distance>::operator*((optional<metaf::Distance> *)0x2442b6);
        (in_RDI->dist).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> = *(_Optional_payload_base<unsigned_int> *)pDVar3
        ;
        *(undefined8 *)&in_RDI->distUnit =
             *(undefined8 *)
              &(pDVar3->dist).super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged;
      }
      else {
        pDVar3 = std::optional<metaf::Distance>::operator*((optional<metaf::Distance> *)0x2442d9);
        (in_RDI->dist).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> = *(_Optional_payload_base<unsigned_int> *)pDVar3
        ;
        *(undefined8 *)&in_RDI->distUnit =
             *(undefined8 *)
              &(pDVar3->dist).super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged;
      }
      *(undefined4 *)
       &in_RDI[5].dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = in_EDX;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool VisibilityGroup::appendFraction(const std::string & group, IncompleteText next) {
	if (group.find('/') == std::string::npos) return false;
	const auto v = Distance::fromMileString(group, true);
	if (!v.has_value()) return false;
	if (vis.isReported()) {
		const auto d = Distance::fromIntegerAndFraction(vis, std::move(*v));
		if (!d.has_value()) return false;
		vis = std::move(*d);
	} else {
		vis = std::move(*v);
	}
	incompleteText = next;
	return true;
}